

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2sp_ref.c
# Opt level: O3

int blake2sp(void *out,size_t outlen,void *in,size_t inlen,void *key,size_t keylen)

{
  int iVar1;
  int iVar2;
  size_t __n;
  blake2s_state *S_00;
  size_t sVar3;
  size_t inlen_00;
  long lVar4;
  size_t sVar5;
  void *pin;
  uint8_t hash [8] [32];
  blake2s_state FS [1];
  blake2s_state S [8] [1];
  blake2s_param local_628 [8];
  blake2s_param local_528;
  blake2s_state local_508;
  blake2s_state local_478 [7];
  undefined1 local_40;
  
  iVar1 = -1;
  if ((out != (void *)0x0) && (in != (void *)0x0 || inlen == 0)) {
    if ((keylen < 0x21) &&
       ((0xffffffffffffffdf < outlen - 0x21 && (key != (void *)0x0 || keylen == 0)))) {
      S_00 = local_478;
      lVar4 = 0;
      do {
        local_628[0].fanout = '\b';
        local_628[0].depth = '\x02';
        local_628[0].leaf_length = 0;
        local_628[0].node_offset._0_1_ = (undefined1)lVar4;
        local_628[0]._9_4_ = 0;
        local_628[0]._13_2_ = 0;
        local_628[0].inner_length = 0x20;
        local_628[0].salt[0] = '\0';
        local_628[0].salt[1] = '\0';
        local_628[0].salt[2] = '\0';
        local_628[0].salt[3] = '\0';
        local_628[0].salt[4] = '\0';
        local_628[0].salt[5] = '\0';
        local_628[0].salt[6] = '\0';
        local_628[0].salt[7] = '\0';
        local_628[0].personal[0] = '\0';
        local_628[0].personal[1] = '\0';
        local_628[0].personal[2] = '\0';
        local_628[0].personal[3] = '\0';
        local_628[0].personal[4] = '\0';
        local_628[0].personal[5] = '\0';
        local_628[0].personal[6] = '\0';
        local_628[0].personal[7] = '\0';
        local_628[0].digest_length = (uint8_t)outlen;
        local_628[0].key_length = (uint8_t)keylen;
        iVar1 = blake2s_init_param(S_00,local_628);
        S_00->outlen = (ulong)local_628[0].inner_length;
        if (iVar1 < 0) {
          return -1;
        }
        lVar4 = lVar4 + 1;
        S_00 = S_00 + 1;
      } while (lVar4 != 8);
      local_40 = 1;
      if (keylen != 0) {
        sVar5 = 0;
        __n = -(keylen - 0x40);
        if (0x3f < keylen) {
          __n = sVar5;
        }
        memset(local_628[0].salt + (keylen - 0x10),0,__n);
        memcpy(local_628,key,keylen);
        do {
          blake2s_update((blake2s_state *)((long)local_478[0].h + sVar5),local_628,0x40);
          sVar5 = sVar5 + 0x88;
        } while (sVar5 != 0x440);
        memset(local_628,0,0x40);
      }
      lVar4 = 0;
      do {
        pin = (void *)((long)in + lVar4 * 0x40);
        sVar3 = inlen;
        if (0x1ff < inlen) {
          do {
            blake2s_update(local_478 + lVar4,pin,0x40);
            pin = (void *)((long)pin + 0x200);
            sVar3 = sVar3 - 0x200;
          } while (0x1ff < sVar3);
        }
        inlen_00 = sVar3 + lVar4 * -0x40;
        if ((ulong)(lVar4 * 0x40) <= sVar3 && inlen_00 != 0) {
          if (0x3f < inlen_00) {
            inlen_00 = 0x40;
          }
          blake2s_update(local_478 + lVar4,pin,inlen_00);
        }
        blake2s_final(local_478 + lVar4,local_628 + lVar4,0x20);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 8);
      local_528.fanout = '\b';
      local_528.depth = '\x02';
      local_528.leaf_length = 0;
      local_528.node_offset = 0;
      local_528.xof_length = 0;
      local_528.node_depth = '\x01';
      local_528.inner_length = ' ';
      local_528.salt[0] = '\0';
      local_528.salt[1] = '\0';
      local_528.salt[2] = '\0';
      local_528.salt[3] = '\0';
      local_528.salt[4] = '\0';
      local_528.salt[5] = '\0';
      local_528.salt[6] = '\0';
      local_528.salt[7] = '\0';
      local_528.personal[0] = '\0';
      local_528.personal[1] = '\0';
      local_528.personal[2] = '\0';
      local_528.personal[3] = '\0';
      local_528.personal[4] = '\0';
      local_528.personal[5] = '\0';
      local_528.personal[6] = '\0';
      local_528.personal[7] = '\0';
      local_528.digest_length = (uint8_t)outlen;
      local_528.key_length = (uint8_t)keylen;
      iVar2 = blake2s_init_param(&local_508,&local_528);
      iVar1 = -1;
      if (-1 < iVar2) {
        local_508.last_node = '\x01';
        lVar4 = 0;
        do {
          blake2s_update(&local_508,local_628[0].salt + lVar4 + -0x10,0x20);
          lVar4 = lVar4 + 0x20;
        } while (lVar4 != 0x100);
        iVar1 = blake2s_final(&local_508,out,outlen);
      }
    }
  }
  return iVar1;
}

Assistant:

int blake2sp( void *out, size_t outlen, const void *in, size_t inlen, const void *key, size_t keylen )
{
  uint8_t hash[PARALLELISM_DEGREE][BLAKE2S_OUTBYTES];
  blake2s_state S[PARALLELISM_DEGREE][1];
  blake2s_state FS[1];
  size_t i;

  /* Verify parameters */
  if ( NULL == in && inlen > 0 ) return -1;

  if ( NULL == out ) return -1;

  if ( NULL == key && keylen > 0) return -1;

  if( !outlen || outlen > BLAKE2S_OUTBYTES ) return -1;

  if( keylen > BLAKE2S_KEYBYTES ) return -1;

  for( i = 0; i < PARALLELISM_DEGREE; ++i )
    if( blake2sp_init_leaf( S[i], outlen, keylen, (uint32_t)i ) < 0 ) return -1;

  S[PARALLELISM_DEGREE - 1]->last_node = 1; /* mark last node */

  if( keylen > 0 )
  {
    uint8_t block[BLAKE2S_BLOCKBYTES];
    memset( block, 0, BLAKE2S_BLOCKBYTES );
    memcpy( block, key, keylen );

    for( i = 0; i < PARALLELISM_DEGREE; ++i )
      blake2s_update( S[i], block, BLAKE2S_BLOCKBYTES );

    secure_zero_memory( block, BLAKE2S_BLOCKBYTES ); /* Burn the key from stack */
  }

#if defined(_OPENMP)
  #pragma omp parallel shared(S,hash), num_threads(PARALLELISM_DEGREE)
#else

  for( i = 0; i < PARALLELISM_DEGREE; ++i )
#endif
  {
#if defined(_OPENMP)
    size_t      i = omp_get_thread_num();
#endif
    size_t inlen__ = inlen;
    const unsigned char *in__ = ( const unsigned char * )in;
    in__ += i * BLAKE2S_BLOCKBYTES;

    while( inlen__ >= PARALLELISM_DEGREE * BLAKE2S_BLOCKBYTES )
    {
      blake2s_update( S[i], in__, BLAKE2S_BLOCKBYTES );
      in__ += PARALLELISM_DEGREE * BLAKE2S_BLOCKBYTES;
      inlen__ -= PARALLELISM_DEGREE * BLAKE2S_BLOCKBYTES;
    }

    if( inlen__ > i * BLAKE2S_BLOCKBYTES )
    {
      const size_t left = inlen__ - i * BLAKE2S_BLOCKBYTES;
      const size_t len = left <= BLAKE2S_BLOCKBYTES ? left : BLAKE2S_BLOCKBYTES;
      blake2s_update( S[i], in__, len );
    }

    blake2s_final( S[i], hash[i], BLAKE2S_OUTBYTES );
  }

  if( blake2sp_init_root( FS, outlen, keylen ) < 0 )
    return -1;

  FS->last_node = 1;

  for( i = 0; i < PARALLELISM_DEGREE; ++i )
    blake2s_update( FS, hash[i], BLAKE2S_OUTBYTES );

  return blake2s_final( FS, out, outlen );
}